

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

void v4dwt_interleave_v(v4dwt_t *v,float *a,int x,int nb_elts_read)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  int i;
  v4 *bi;
  int local_24;
  
  lVar2 = *in_RDI;
  lVar3 = in_RDI[2];
  for (local_24 = 0; local_24 < *(int *)((long)in_RDI + 0xc); local_24 = local_24 + 1) {
    memcpy((void *)(lVar2 + (long)(int)lVar3 * 0x10 + (long)(local_24 << 1) * 0x10),
           (void *)(in_RSI + (long)(local_24 * in_EDX) * 4),(long)in_ECX << 2);
  }
  iVar1 = *(int *)((long)in_RDI + 0xc);
  lVar2 = *in_RDI;
  lVar3 = in_RDI[2];
  for (local_24 = 0; local_24 < (int)in_RDI[1]; local_24 = local_24 + 1) {
    memcpy((void *)(lVar2 + 0x10 + (long)(int)lVar3 * -0x10 + (long)(local_24 << 1) * 0x10),
           (void *)(in_RSI + (long)(iVar1 * in_EDX) * 4 + (long)(local_24 * in_EDX) * 4),
           (long)in_ECX << 2);
  }
  return;
}

Assistant:

static void v4dwt_interleave_v(v4dwt_t* restrict v , float* restrict a , int x, int nb_elts_read){
	v4* restrict bi = v->wavelet + v->cas;
	int i;

	for(i = 0; i < v->sn; ++i){
		memcpy(&bi[i*2], &a[i*x], nb_elts_read * sizeof(float));
	}

	a += v->sn * x;
	bi = v->wavelet + 1 - v->cas;

	for(i = 0; i < v->dn; ++i){
		memcpy(&bi[i*2], &a[i*x], nb_elts_read * sizeof(float));
	}
}